

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O0

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_llrs_bsc_Test::TestBody
          (rate_adaptive_code_from_colptr_rowIdx_llrs_bsc_Test *this)

{
  initializer_list<bool> __l;
  pointer pdVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  char *message;
  reference rVar5;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  vector<double,_std::allocator<double>_> llrs_convenience;
  ulong local_98;
  size_t i;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> llrs;
  double vlog;
  double p;
  allocator<bool> local_50;
  bool local_4f [7];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<bool,_std::allocator<bool>_> x;
  rate_adaptive_code_from_colptr_rowIdx_llrs_bsc_Test *this_local;
  
  local_4f[0] = true;
  local_4f[1] = true;
  local_4f[2] = true;
  local_4f[3] = true;
  local_4f[4] = false;
  local_4f[5] = false;
  local_4f[6] = false;
  local_48 = local_4f;
  local_40 = 7;
  x.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)this;
  std::allocator<bool>::allocator(&local_50);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_38,__l,&local_50);
  std::allocator<bool>::~allocator(&local_50);
  llrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)log(99.0);
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)local_38);
  std::allocator<double>::allocator((allocator<double> *)((long)&i + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,sVar3,
             (allocator<double> *)((long)&i + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&i + 7));
  for (local_98 = 0;
      sVar3 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)local_88),
      pdVar1 = llrs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage, local_98 < sVar3; local_98 = local_98 + 1)
  {
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_38,local_98);
    llrs_convenience.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)rVar5._M_p;
    bVar2 = std::_Bit_reference::operator_cast_to_bool
                      ((_Bit_reference *)
                       &llrs_convenience.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,local_98);
    *pvVar4 = (double)pdVar1 * (double)(int)((uint)bVar2 * -2 + 1);
  }
  LDPC4QKD::llrs_bsc<bool>
            ((vector<double,_std::allocator<double>_> *)&gtest_ar.message_,
             (vector<bool,_std::allocator<bool>_> *)local_38,0.01);
  testing::internal::EqHelper::
  Compare<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>,_nullptr>
            ((EqHelper *)local_d0,"llrs_convenience","llrs",
             (vector<double,_std::allocator<double>_> *)&gtest_ar.message_,
             (vector<double,_std::allocator<double>_> *)local_88);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x132,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&gtest_ar.message_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_38)
  ;
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, llrs_bsc) {
    std::vector<bool> x{1, 1, 1, 1, 0, 0, 0};
    double p = 0.01;

    double vlog = log((1 - p) / p);
    std::vector<double> llrs(x.size());
    for (std::size_t i{}; i < llrs.size(); ++i) {
        llrs[i] = vlog * (1 - 2 * x[i]); // log likelihood ratios
    }

    std::vector<double> llrs_convenience = LDPC4QKD::llrs_bsc(x, p);

    EXPECT_EQ(llrs_convenience, llrs);
}